

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

int debug_putchunkname(SBuf *sb,GCproto *pt,int pathstrip)

{
  GCstr *s;
  int local_70;
  MSize local_6c;
  int i;
  MSize len;
  char *p;
  GCstr *name;
  int pathstrip_local;
  GCproto *pt_local;
  SBuf *sb_local;
  char *w;
  char *local_10;
  
  s = (GCstr *)(pt->chunkname).gcptr64;
  if (pt->firstline == -1) {
    lj_buf_putmem(sb,"[builtin:",9);
    lj_buf_putstr(sb,s);
    if ((int)sb->e == (int)sb->w) {
      local_10 = lj_buf_more2(sb,1);
    }
    else {
      local_10 = sb->w;
    }
    *local_10 = ']';
    sb->w = local_10 + 1;
    sb_local._4_4_ = 0;
  }
  else {
    if (((char)s[1].nextgc.gcptr64 == '=') || ((char)s[1].nextgc.gcptr64 == '@')) {
      local_6c = s->len - 1;
      _i = (void *)((long)&s[1].nextgc.gcptr64 + 1);
      if (pathstrip != 0) {
        for (local_70 = s->len - 2; -1 < local_70; local_70 = local_70 + -1) {
          if ((*(char *)((long)_i + (long)local_70) == '/') ||
             (*(char *)((long)_i + (long)local_70) == '\\')) {
            local_6c = local_6c - (local_70 + 1);
            _i = (void *)((long)_i + (long)local_70 + 1);
            break;
          }
        }
      }
      lj_buf_putmem(sb,_i,local_6c);
    }
    else {
      lj_buf_putmem(sb,"[string]",8);
    }
    sb_local._4_4_ = 1;
  }
  return sb_local._4_4_;
}

Assistant:

static int debug_putchunkname(SBuf *sb, GCproto *pt, int pathstrip)
{
  GCstr *name = proto_chunkname(pt);
  const char *p = strdata(name);
  if (pt->firstline == ~(BCLine)0) {
    lj_buf_putmem(sb, "[builtin:", 9);
    lj_buf_putstr(sb, name);
    lj_buf_putb(sb, ']');
    return 0;
  }
  if (*p == '=' || *p == '@') {
    MSize len = name->len-1;
    p++;
    if (pathstrip) {
      int i;
      for (i = len-1; i >= 0; i--)
	if (p[i] == '/' || p[i] == '\\') {
	  len -= i+1;
	  p = p+i+1;
	  break;
	}
    }
    lj_buf_putmem(sb, p, len);
  } else {
    lj_buf_putmem(sb, "[string]", 8);
  }
  return 1;
}